

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_225155::OSScapture::recordProc(OSScapture *this)

{
  FILE *__stream;
  bool bVar1;
  ALuint AVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  pointer this_00;
  long in_RDI;
  ssize_t amt;
  ll_ringbuffer_data_pair vec;
  int sret;
  pollfd pollitem;
  ALuint frame_size;
  ALCdevice *in_stack_ffffffffffffffa0;
  FILE *__stream_00;
  atomic<bool> *in_stack_ffffffffffffffa8;
  ALCdevice *pAVar7;
  void *local_38;
  long local_30;
  int local_14;
  short sVar8;
  short in_stack_fffffffffffffff2;
  
  SetRTPriority();
  althrd_setname("alsoft-record");
  AVar2 = ALCdevice::frameSizeFromFmt(in_stack_ffffffffffffffa0);
  do {
    while( true ) {
      bVar1 = std::atomic<bool>::load
                        (in_stack_ffffffffffffffa8,
                         (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return 0;
      }
      memset(&local_14,0,8);
      local_14 = *(int *)(in_RDI + 0x10);
      sVar8 = 1;
      iVar3 = poll((pollfd *)&local_14,1,1000);
      if (iVar3 < 0) break;
      if (iVar3 == 0) {
        if (1 < (int)gLogLevel) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (WW) poll timeout\n");
        }
      }
      else {
        std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                  ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x23ad71);
        RingBuffer::getWriteVector
                  ((RingBuffer *)CONCAT44(AVar2,CONCAT22(in_stack_fffffffffffffff2,sVar8)));
        if (local_30 != 0) {
          uVar6 = read(*(int *)(in_RDI + 0x10),local_38,local_30 * (ulong)AVar2);
          if ((long)uVar6 < 0) {
            if (0 < (int)gLogLevel) {
              __stream_00 = (FILE *)gLogFile;
              piVar4 = __errno_location();
              pcVar5 = strerror(*piVar4);
              fprintf(__stream_00,"[ALSOFT] (EE) read failed: %s\n",pcVar5);
            }
            pAVar7 = *(ALCdevice **)(in_RDI + 8);
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            ALCdevice::handleDisconnect(pAVar7,"Failed reading capture samples: %s",pcVar5);
            return 0;
          }
          this_00 = std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                              ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x23ae40)
          ;
          RingBuffer::writeAdvance(this_00,(uVar6 & 0xffffffff) / (ulong)AVar2);
        }
      }
    }
    piVar4 = __errno_location();
  } while ((*piVar4 == 4) || (piVar4 = __errno_location(), __stream = gLogFile, *piVar4 == 0xb));
  if (0 < (int)gLogLevel) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf((FILE *)__stream,"[ALSOFT] (EE) poll failed: %s\n",pcVar5);
  }
  pAVar7 = *(ALCdevice **)(in_RDI + 8);
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  ALCdevice::handleDisconnect(pAVar7,"Failed to check capture samples: %s",pcVar5);
  return 0;
}

Assistant:

int OSScapture::recordProc()
{
    SetRTPriority();
    althrd_setname(RECORD_THREAD_NAME);

    const ALuint frame_size{mDevice->frameSizeFromFmt()};
    while(!mKillNow.load(std::memory_order_acquire))
    {
        pollfd pollitem{};
        pollitem.fd = mFd;
        pollitem.events = POLLIN;

        int sret{poll(&pollitem, 1, 1000)};
        if(sret < 0)
        {
            if(errno == EINTR || errno == EAGAIN)
                continue;
            ERR("poll failed: %s\n", strerror(errno));
            mDevice->handleDisconnect("Failed to check capture samples: %s", strerror(errno));
            break;
        }
        else if(sret == 0)
        {
            WARN("poll timeout\n");
            continue;
        }

        auto vec = mRing->getWriteVector();
        if(vec.first.len > 0)
        {
            ssize_t amt{read(mFd, vec.first.buf, vec.first.len*frame_size)};
            if(amt < 0)
            {
                ERR("read failed: %s\n", strerror(errno));
                mDevice->handleDisconnect("Failed reading capture samples: %s", strerror(errno));
                break;
            }
            mRing->writeAdvance(static_cast<ALuint>(amt)/frame_size);
        }
    }

    return 0;
}